

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_24(QPDF *pdf,char *arg2)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  QPDFWriter local_1b8 [8];
  QPDFWriter w;
  QPDFObjectHandle local_1a8;
  QPDFObjectHandle local_198;
  int local_184;
  undefined1 local_180 [4];
  int i2;
  QPDFObjectHandle local_170;
  int local_15c;
  undefined1 local_158 [4];
  int i1;
  QPDFObjectHandle local_148;
  logic_error *e_1;
  logic_error *e;
  QPDFObjectHandle local_108;
  QPDFObjectHandle local_f8;
  QPDFObjectHandle local_e8;
  QPDFObjectHandle local_d8;
  undefined1 local_c8 [8];
  QPDFObjectHandle array2;
  QPDFObjectHandle array1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  QPDFObjectHandle trailer;
  undefined1 local_38 [8];
  QPDFObjectHandle res2;
  QPDFObjectHandle res1;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFObjectHandle::newReserved
            ((QPDF *)&res2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QPDFObjectHandle::newReserved((QPDF *)local_38);
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"Array1",&local_79);
  QPDFObjectHandle::replaceKey((string *)local_58,(QPDFObjectHandle *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Array2",
             (allocator<char> *)
             ((long)&array1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::replaceKey((string *)local_58,(QPDFObjectHandle *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&array1.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
             7));
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::appendItem
            ((QPDFObjectHandle *)
             &array2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDFObjectHandle::newInteger((longlong)&local_d8);
  QPDFObjectHandle::appendItem
            ((QPDFObjectHandle *)
             &array2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle(&local_d8);
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_c8);
  QPDFObjectHandle::newInteger((longlong)&local_e8);
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)local_c8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  bVar1 = QPDFObjectHandle::isArray();
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"oops -- res1 is an array");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  bVar1 = QPDFObjectHandle::isReserved();
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"res1 is still reserved after checking if array")
    ;
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  QPDFObjectHandle::QPDFObjectHandle
            (&local_f8,
             (QPDFObjectHandle *)
             &res2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::QPDFObjectHandle
            (&local_108,
             (QPDFObjectHandle *)
             &array2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDF::replaceReserved((QPDFObjectHandle *)pdf,(QPDFObjectHandle *)&local_f8);
  QPDFObjectHandle::~QPDFObjectHandle(&local_108);
  QPDFObjectHandle::~QPDFObjectHandle(&local_f8);
  bVar1 = QPDFObjectHandle::isReserved();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"res1 is no longer reserved");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"oops -- res1 is still reserved");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  QPDFObjectHandle::assertArray();
  poVar3 = std::operator<<((ostream *)&std::cout,"res1 is an array");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  std::__cxx11::string::~string((string *)&e);
  poVar3 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::makeDirect(SUB81(local_38,0));
  poVar3 = std::operator<<((ostream *)&std::cout,"oops -- didn\'t throw");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::QPDFObjectHandle(&local_148,(QPDFObjectHandle *)local_38);
  QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)local_158,(QPDFObjectHandle *)local_c8);
  QPDF::replaceReserved((QPDFObjectHandle *)pdf,(QPDFObjectHandle *)&local_148);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_158);
  QPDFObjectHandle::~QPDFObjectHandle(&local_148);
  QPDFObjectHandle::assertArray();
  poVar3 = std::operator<<((ostream *)&std::cout,"res2 is an array");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  QPDFObjectHandle::getArrayItem((int)local_180);
  QPDFObjectHandle::getArrayItem((int)&local_170);
  iVar2 = QPDFObjectHandle::getIntValueAsInt();
  QPDFObjectHandle::~QPDFObjectHandle(&local_170);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_180);
  local_15c = iVar2;
  QPDFObjectHandle::getArrayItem((int)&local_1a8);
  QPDFObjectHandle::getArrayItem((int)&local_198);
  iVar2 = QPDFObjectHandle::getIntValueAsInt();
  QPDFObjectHandle::~QPDFObjectHandle(&local_198);
  QPDFObjectHandle::~QPDFObjectHandle(&local_1a8);
  local_184 = iVar2;
  if ((local_15c == 2) && (iVar2 == 1)) {
    poVar3 = std::operator<<((ostream *)&std::cout,"circular access and lazy resolution worked");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  QPDFWriter::QPDFWriter(local_1b8,pdf,"a.pdf");
  QPDFWriter::setStaticID(SUB81(local_1b8,0));
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_1b8);
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_1b8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_c8);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &array2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_58);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &res2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_24(QPDF& pdf, char const* arg2)
{
    // Test behavior of reserved objects
    QPDFObjectHandle res1 = QPDFObjectHandle::newReserved(&pdf);
    QPDFObjectHandle res2 = QPDFObjectHandle::newReserved(&pdf);
    QPDFObjectHandle trailer = pdf.getTrailer();
    trailer.replaceKey("Array1", res1);
    trailer.replaceKey("Array2", res2);

    QPDFObjectHandle array1 = QPDFObjectHandle::newArray();
    QPDFObjectHandle array2 = QPDFObjectHandle::newArray();
    array1.appendItem(res2);
    array1.appendItem(QPDFObjectHandle::newInteger(1));
    array2.appendItem(res1);
    array2.appendItem(QPDFObjectHandle::newInteger(2));
    // Make sure trying to ask questions about a reserved object
    // doesn't break it.
    if (res1.isArray()) {
        std::cout << "oops -- res1 is an array" << std::endl;
    }
    if (res1.isReserved()) {
        std::cout << "res1 is still reserved after checking if array" << std::endl;
    }
    pdf.replaceReserved(res1, array1);
    if (res1.isReserved()) {
        std::cout << "oops -- res1 is still reserved" << std::endl;
    } else {
        std::cout << "res1 is no longer reserved" << std::endl;
    }
    res1.assertArray();
    std::cout << "res1 is an array" << std::endl;

    try {
        res2.unparseResolved();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
    try {
        res2.makeDirect();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    pdf.replaceReserved(res2, array2);

    res2.assertArray();
    std::cout << "res2 is an array" << std::endl;

    // Verify that the previously added reserved keys can be
    // dereferenced properly now
    int i1 = res1.getArrayItem(0).getArrayItem(1).getIntValueAsInt();
    int i2 = res2.getArrayItem(0).getArrayItem(1).getIntValueAsInt();
    if ((i1 == 2) && (i2 == 1)) {
        std::cout << "circular access and lazy resolution worked" << std::endl;
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}